

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_EvalHop_rec(Hop_Man_t *pHop,Hop_Obj_t *pObj,int *f,int *dc)

{
  Hop_Obj_t *pHVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pReg;
  int dc2;
  int f2;
  int dc1;
  int f1;
  int *dc_local;
  int *f_local;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *pHop_local;
  
  _dc1 = (uint *)dc;
  dc_local = f;
  f_local = (int *)pObj;
  pObj_local = (Hop_Obj_t *)pHop;
  pHVar3 = Hop_Regular(pObj);
  iVar2 = Hop_ObjIsConst1(pHVar3);
  if (iVar2 == 0) {
    iVar2 = Hop_ObjIsPi(pHVar3);
    if (iVar2 == 0) {
      iVar2 = Hop_ObjIsPo(pHVar3);
      pHVar1 = pObj_local;
      if (iVar2 == 0) {
        iVar2 = Hop_ObjIsAnd(pHVar3);
        pHVar1 = pObj_local;
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0xfc,
                        "void Abc_FlowRetime_EvalHop_rec(Hop_Man_t *, Hop_Obj_t *, int *, int *)");
        }
        pHVar4 = Hop_ObjChild0(pHVar3);
        Abc_FlowRetime_EvalHop_rec((Hop_Man_t *)pHVar1,pHVar4,&f2,&dc2);
        pHVar1 = pObj_local;
        pHVar4 = Hop_ObjChild1(pHVar3);
        Abc_FlowRetime_EvalHop_rec((Hop_Man_t *)pHVar1,pHVar4,(int *)((long)&pReg + 4),(int *)&pReg)
        ;
        *_dc1 = dc2 & pReg._4_4_ | (uint)pReg & f2 | dc2 & (uint)pReg;
        *dc_local = f2 & pReg._4_4_;
        *dc_local = (uint)(pHVar3 == (Hop_Obj_t *)f_local) ^ *dc_local;
      }
      else {
        if (pHVar3 != (Hop_Obj_t *)f_local) {
          __assert_fail("pReg == pObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0xec,
                        "void Abc_FlowRetime_EvalHop_rec(Hop_Man_t *, Hop_Obj_t *, int *, int *)");
        }
        pHVar3 = Hop_ObjChild0(pHVar3);
        Abc_FlowRetime_EvalHop_rec((Hop_Man_t *)pHVar1,pHVar3,dc_local,(int *)_dc1);
      }
    }
    else {
      *dc_local = *(uint *)&pHVar3->field_0x20 >> 4 & 1;
      *dc_local = (uint)(pHVar3 == (Hop_Obj_t *)f_local) ^ *dc_local;
      *_dc1 = *(uint *)&pHVar3->field_0x20 >> 5 & 1;
    }
  }
  else {
    *dc_local = 1;
    *dc_local = (uint)(pHVar3 == (Hop_Obj_t *)f_local) ^ *dc_local;
    *_dc1 = 0;
  }
  return;
}

Assistant:

static void Abc_FlowRetime_EvalHop_rec( Hop_Man_t *pHop, Hop_Obj_t *pObj, int *f, int *dc ) {
  int f1, dc1, f2, dc2;
  Hop_Obj_t *pReg = Hop_Regular(pObj);
  
  // const 0
  if (Hop_ObjIsConst1(pReg)) {
    *f  = 1;
    *f ^= (pReg == pObj ? 1 : 0);
    *dc = 0;
    return;
  }

  // PI
  if (Hop_ObjIsPi(pReg)) {
    *f  = pReg->fMarkA;
    *f ^= (pReg == pObj ? 1 : 0);
    *dc = pReg->fMarkB;
    return;
  }

  // PO
  if (Hop_ObjIsPo(pReg)) {
    assert( pReg == pObj );
    Abc_FlowRetime_EvalHop_rec(pHop, Hop_ObjChild0(pReg), f, dc);
    return;
  }

  // AND
  if (Hop_ObjIsAnd(pReg)) {
    Abc_FlowRetime_EvalHop_rec(pHop, Hop_ObjChild0(pReg), &f1, &dc1);
    Abc_FlowRetime_EvalHop_rec(pHop, Hop_ObjChild1(pReg), &f2, &dc2);

    *dc = (dc1 & f2) | (dc2 & f1) | (dc1 & dc2);
    *f  = f1 & f2;
    *f ^= (pReg == pObj ? 1 : 0);
    return;
  }

  assert(0);
}